

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  rtree_ctx_cache_elm_t *prVar1;
  int iVar2;
  void *pvVar3;
  arena_t *arena;
  rtree_leaf_elm_t *prVar4;
  long lVar5;
  _Bool _Var6;
  szind_t sVar7;
  uint uVar8;
  arena_tdata_t *paVar9;
  void *pvVar10;
  size_t usize_min;
  rtree_ctx_t *ctx;
  ulong uVar11;
  size_t usize_max;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_leaf_elm_t *prVar14;
  extent_t *extent;
  ulong uVar15;
  bool bVar16;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar10 = (void *)((ulong)ptr & 0xffffffffc0000000);
  uVar15 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  prVar14 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar15);
  pvVar3 = *(void **)((long)&ctx->cache[0].leafkey + uVar15);
  if (pvVar3 == pvVar10) {
    prVar14 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar14[1].le_bits.repr);
  }
  else if ((void *)ctx->l2_cache[0].leafkey == pvVar10) {
    prVar4 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)pvVar3;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar14[1].le_bits.repr;
    (prVar14->le_bits).repr = pvVar10;
    prVar14[1].le_bits.repr = prVar4;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar4->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    prVar12 = ctx->l2_cache + 1;
    if ((void *)ctx->l2_cache[1].leafkey == pvVar10) {
      uVar11 = 0;
      bVar16 = false;
    }
    else {
      uVar15 = 1;
      prVar13 = prVar12;
      do {
        uVar11 = uVar15;
        bVar16 = 6 < uVar11;
        if (uVar11 == 7) goto LAB_0010f045;
        prVar12 = prVar13 + 1;
        prVar1 = prVar13 + 1;
        uVar15 = uVar11 + 1;
        prVar13 = prVar12;
      } while ((void *)prVar1->leafkey != pvVar10);
      bVar16 = 6 < uVar11;
    }
    prVar4 = prVar12->leaf;
    prVar12->leafkey = ctx->l2_cache[uVar11].leafkey;
    prVar12->leaf = ctx->l2_cache[uVar11].leaf;
    ctx->l2_cache[uVar11].leafkey = (uintptr_t)pvVar3;
    ctx->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)prVar14[1].le_bits.repr;
    (prVar14->le_bits).repr = pvVar10;
    prVar14[1].le_bits.repr = prVar4;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0010f045:
    if (bVar16) {
      prVar14 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
    }
  }
  extent = (extent_t *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  _Var6 = true;
  if (0x7000000000000000 < size) goto LAB_0010ee59;
  if (size < 0x1001) {
    usize_min = sz_index2size_tab[sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    uVar15 = size * 2 - 1;
    lVar5 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    uVar15 = ~(-1L << ((char)lVar5 - 3U & 0x3f));
    if ((uint)lVar5 < 7) {
      uVar15 = 0xf;
    }
    usize_min = ~uVar15 & uVar15 + size;
  }
  uVar15 = extra + size;
  if (uVar15 < 0x1001) {
    usize_max = sz_index2size_tab[sz_size2index_tab[uVar15 + 7 >> 3]];
  }
  else if (uVar15 < 0x7000000000000001) {
    uVar11 = uVar15 * 2 - 1;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    uVar11 = ~(-1L << ((char)lVar5 - 3U & 0x3f));
    if ((uint)lVar5 < 7) {
      uVar11 = 0xf;
    }
    usize_max = ~uVar11 & uVar15 + uVar11;
  }
  else {
    usize_max = 0;
  }
  if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
    if ((0x3fff < oldsize) && (0x3fff < usize_max)) {
      _Var6 = large_ralloc_no_move(tsdn,extent,usize_min,usize_max,zero);
    }
    goto LAB_0010ee59;
  }
  if (usize_max < 0x3801) {
    if (usize_max < 0x1001) {
      sVar7 = (szind_t)sz_size2index_tab[usize_max + 7 >> 3];
    }
    else {
      sVar7 = sz_size2index_compute(usize_max);
    }
    if (oldsize < 0x1001) {
      uVar8 = (uint)sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar8 = sz_size2index_compute(oldsize);
    }
    if (sVar7 != uVar8) goto LAB_0010ee01;
  }
  else {
LAB_0010ee01:
    _Var6 = true;
    if ((oldsize < size) || (usize_max < oldsize)) goto LAB_0010ee59;
  }
  arena = (arena_t *)arenas[(uint)extent->e_bits & 0xfff].repr;
  if (tsdn != (tsdn_t *)0x0) {
    uVar8 = arena->base->ind;
    paVar9 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata;
    if ((paVar9 == (arena_tdata_t *)0x0) ||
       ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= uVar8)) {
      paVar9 = arena_tdata_get_hard(&tsdn->tsd,uVar8);
    }
    else {
      paVar9 = paVar9 + uVar8;
    }
    if ((paVar9 != (arena_tdata_t *)0x0) &&
       (iVar2 = (paVar9->decay_ticker).tick, (paVar9->decay_ticker).tick = iVar2 + -1, iVar2 < 1)) {
      (paVar9->decay_ticker).tick = (paVar9->decay_ticker).nticks;
      arena_decay(tsdn,arena,false,false);
      _Var6 = false;
      goto LAB_0010ee59;
    }
  }
  _Var6 = false;
LAB_0010ee59:
  *newsize = *(size_t *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  return _Var6;
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	extent_t *extent = iealloc(tsdn, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_decay_tick(tsdn, extent_arena_get(extent));
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, extent, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(extent == iealloc(tsdn, ptr));
	*newsize = extent_usize_get(extent);

	return ret;
}